

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::EnumDescriptorProto::_InternalParse
          (EnumDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  string *psVar4;
  EnumOptions *msg;
  EnumDescriptorProto_EnumReservedRange *msg_00;
  Rep *pRVar5;
  EnumValueDescriptorProto *msg_01;
  char cVar6;
  uint32 res;
  uint tag;
  char *ptr_00;
  int iVar7;
  Arena *pAVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_bool> pVar10;
  
  this_00 = &this->name_;
LAB_0017235b:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar10 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar10.first;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    bVar1 = *ptr;
    pVar9.second._0_1_ = bVar1;
    pVar9.first = (char *)((byte *)ptr + 1);
    pVar9._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = internal::ReadTagFallback(ptr,res);
        if (pVar9.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pVar9.second = res;
        pVar9.first = (char *)((byte *)ptr + 2);
        pVar9._12_4_ = 0;
      }
    }
    ptr_00 = pVar9.first;
    tag = pVar9.second;
    cVar6 = (char)pVar9.second;
    switch((uint)(pVar9._8_8_ >> 3) & 0x1fffffff) {
    case 1:
      if (cVar6 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pAVar8 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = this_00->ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_00,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar4 = this_00->ptr_;
      }
      ptr = internal::InlineGreedyStringParser(psVar4,ptr_00,ctx);
      goto LAB_001726b6;
    case 2:
      if (cVar6 == '\x12') {
        ptr = ptr_00 + -1;
        do {
          pRVar5 = (this->value_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
            iVar7 = (this->value_).super_RepeatedPtrFieldBase.total_size_;
LAB_0017260a:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->value_).super_RepeatedPtrFieldBase,iVar7 + 1);
            pRVar5 = (this->value_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = pRVar5->allocated_size;
LAB_0017261c:
            pRVar5->allocated_size = iVar7 + 1;
            msg_01 = Arena::CreateMaybeMessage<google::protobuf::EnumValueDescriptorProto>
                               ((this->value_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->value_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
            (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            pRVar5->elements[iVar7] = msg_01;
          }
          else {
            iVar3 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
            iVar7 = pRVar5->allocated_size;
            if (iVar7 <= iVar3) {
              if (iVar7 == (this->value_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0017260a;
              goto LAB_0017261c;
            }
            (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_01 = (EnumValueDescriptorProto *)pRVar5->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumValueDescriptorProto>
                          (ctx,msg_01,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x12));
        goto LAB_0017235b;
      }
      break;
    case 3:
      if (cVar6 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        msg = this->options_;
        if (msg == (EnumOptions *)0x0) {
          pAVar8 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
          }
          msg = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(pAVar8);
          this->options_ = msg;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumOptions>(ctx,msg,ptr_00);
        goto LAB_001726b6;
      }
      break;
    case 4:
      if (cVar6 == '\"') {
        ptr = ptr_00 + -1;
        do {
          pRVar5 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
            iVar7 = (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_;
LAB_00172562:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar7 + 1);
            pRVar5 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = pRVar5->allocated_size;
LAB_00172574:
            pRVar5->allocated_size = iVar7 + 1;
            msg_00 = Arena::
                     CreateMaybeMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                               ((this->reserved_range_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
            (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            pRVar5->elements[iVar7] = msg_00;
          }
          else {
            iVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
            iVar7 = pRVar5->allocated_size;
            if (iVar7 <= iVar3) {
              if (iVar7 == (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00172562;
              goto LAB_00172574;
            }
            (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_00 = (EnumDescriptorProto_EnumReservedRange *)pRVar5->elements[iVar3];
          }
          ptr = internal::ParseContext::
                ParseMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                          (ctx,msg_00,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x22));
        goto LAB_0017235b;
      }
      break;
    case 5:
      if (cVar6 == '*') {
        ptr = ptr_00 + -1;
        do {
          pRVar5 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
            iVar7 = (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
LAB_00172451:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar7 + 1);
            pRVar5 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = pRVar5->allocated_size;
LAB_00172461:
            pRVar5->allocated_size = iVar7 + 1;
            pAVar8 = (this->reserved_name_).super_RepeatedPtrFieldBase.arena_;
            if (pAVar8 == (Arena *)0x0) {
              psVar4 = (string *)operator_new(0x20);
            }
            else {
              if (pAVar8->hooks_cookie_ != (void *)0x0) {
                Arena::OnArenaAllocation(pAVar8,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              }
              psVar4 = (string *)
                       internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                 (&pAVar8->impl_,0x20,
                                  internal::arena_destruct_object<std::__cxx11::string>);
            }
            (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
            psVar4->_M_string_length = 0;
            (psVar4->field_2)._M_local_buf[0] = '\0';
            pRVar5 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
            iVar7 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
            pRVar5->elements[iVar7] = psVar4;
          }
          else {
            iVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
            iVar7 = pRVar5->allocated_size;
            if (iVar7 <= iVar3) {
              if (iVar7 == (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00172451;
              goto LAB_00172461;
            }
            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            psVar4 = (string *)pRVar5->elements[iVar3];
          }
          ptr = internal::InlineGreedyStringParser(psVar4,(char *)((byte *)ptr + 1),ctx);
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x2a));
        goto LAB_0017235b;
      }
    }
    if ((tag == 0) || ((tag & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      return ptr_00;
    }
    ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr_00,ctx);
LAB_001726b6:
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* EnumDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.EnumDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_value(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.EnumOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_reserved_name(), ptr, ctx, "google.protobuf.EnumDescriptorProto.reserved_name");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}